

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_header.cc
# Opt level: O1

bool webrtc::CheckWavParameters
               (size_t num_channels,int sample_rate,WavFormat format,size_t bytes_per_sample,
               size_t num_samples)

{
  undefined1 auVar1 [16];
  
  if ((((bytes_per_sample != 0 && num_channels != 0) && 0 < sample_rate) &&
      ((bytes_per_sample & 0x1fffffffffffe000) == 0 && num_channels < 0x10000)) &&
     (num_channels * bytes_per_sample * (ulong)(uint)sample_rate >> 0x20 == 0)) {
    if (format - kWavFormatALaw < 2) {
      if (bytes_per_sample == 1) {
LAB_0014f872:
        auVar1._8_8_ = 0;
        auVar1._0_8_ = bytes_per_sample;
        if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffdb)) / auVar1,0) < num_samples) {
          return false;
        }
        return num_samples % num_channels == 0;
      }
    }
    else if ((format == kWavFormatPcm) && (0xfffffffffffffffd < bytes_per_sample - 3))
    goto LAB_0014f872;
  }
  return false;
}

Assistant:

bool CheckWavParameters(size_t num_channels,
                        int sample_rate,
                        WavFormat format,
                        size_t bytes_per_sample,
                        size_t num_samples) {
  // num_channels, sample_rate, and bytes_per_sample must be positive, must fit
  // in their respective fields, and their product must fit in the 32-bit
  // ByteRate field.
  if (num_channels == 0 || sample_rate <= 0 || bytes_per_sample == 0)
    return false;
  if (static_cast<uint64_t>(sample_rate) > std::numeric_limits<uint32_t>::max())
    return false;
  if (num_channels > std::numeric_limits<uint16_t>::max())
    return false;
  if (static_cast<uint64_t>(bytes_per_sample) * 8 >
      std::numeric_limits<uint16_t>::max())
    return false;
  if (static_cast<uint64_t>(sample_rate) * num_channels * bytes_per_sample >
      std::numeric_limits<uint32_t>::max())
    return false;

  // format and bytes_per_sample must agree.
  switch (format) {
    case kWavFormatPcm:
      // Other values may be OK, but for now we're conservative:
      if (bytes_per_sample != 1 && bytes_per_sample != 2)
        return false;
      break;
    case kWavFormatALaw:
    case kWavFormatMuLaw:
      if (bytes_per_sample != 1)
        return false;
      break;
    default:
      return false;
  }

  // The number of bytes in the file, not counting the first ChunkHeader, must
  // be less than 2^32; otherwise, the ChunkSize field overflows.
  const size_t header_size = kWavHeaderSize - sizeof(ChunkHeader);
  const size_t max_samples =
      (std::numeric_limits<uint32_t>::max() - header_size) / bytes_per_sample;
  if (num_samples > max_samples)
    return false;

  // Each channel must have the same number of samples.
  if (num_samples % num_channels != 0)
    return false;

  return true;
}